

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void __thiscall Logger::log<int>(Logger *this,char *id,uint64_t pTime,uint64_t pThread,int *ts)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  size_t sz_1;
  uint8_t *usedBuffer;
  uint8_t buffer [2048];
  ssize_t rv;
  size_t sz;
  uint8_t local_2058 [4];
  int flen;
  uint8_t logbuff [8192];
  undefined1 local_50 [8];
  logful_context_t ctx;
  int *ts_local;
  uint64_t pThread_local;
  uint64_t pTime_local;
  char *id_local;
  Logger *this_local;
  
  ctx._24_8_ = ts;
  if ((this->mLogful & 1U) != 0) {
    logful_context_t::logful_context_t((logful_context_t *)local_50);
    iVar1 = sprintf((char *)local_2058,"%lluus %llut ",pTime,pThread);
    sVar2 = logful<int>(this,(logful_context_t *)local_50,local_2058 + iVar1,id,*(int *)ctx._24_8_);
    lVar3 = (long)iVar1 + sVar2;
    local_2058[lVar3] = '\n';
    write(1,local_2058,lVar3 + 1);
    logful_context_t::~logful_context_t((logful_context_t *)local_50);
  }
  usedBuffer = (uint8_t *)(id + -(long)LoggerRef);
  sVar2 = logless<unsigned_long,unsigned_long,int>(this,buffer,pTime,pThread,*(int *)ctx._24_8_);
  fwrite(&usedBuffer,1,sVar2 + 8,(FILE *)this->mOutputFile);
  return;
}

Assistant:

void log(const char * id, uint64_t pTime, uint64_t pThread, const Ts&... ts)
    {
        if (mLogful)
        {
            logful_context_t ctx;
            uint8_t logbuff[4096*2];
            int flen = std::sprintf((char*)logbuff, "%lluus %llut ", (unsigned long long)pTime, (unsigned long long)pThread);
            size_t sz = flen + 
            logful(ctx, logbuff + flen, id, ts...);
            logbuff[sz++] = '\n';
            [[maybe_unused]] auto rv = ::write(1, logbuff, sz);
        }
        {
            uint8_t buffer[2048];
            uint8_t* usedBuffer = buffer;
            new (usedBuffer) HeaderType(intptr_t(id)-intptr_t(LoggerRef));
            usedBuffer += sizeof(HeaderType);
            size_t sz = logless(usedBuffer, pTime, pThread, ts...) + sizeof(HeaderType);
            std::fwrite((char*)buffer, 1, sz, mOutputFile);
        }
    }